

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O3

void google::protobuf::internal::PrintAllCounters(void)

{
  _Base_ptr *pp_Var1;
  FILE *output;
  Map *pMVar2;
  _Base_ptr p_Var3;
  Data *pDVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  iterator __begin3;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  UntypedFormatSpecImpl format_02;
  UntypedFormatSpecImpl format_03;
  UntypedFormatSpecImpl format_04;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_02;
  Data local_78;
  code *local_70;
  long local_68;
  code *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  double local_48;
  double dStack_40;
  
  pMVar2 = CounterMap();
  if ((pMVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    format.size_ = 0x19;
    format.data_ = "Protobuf debug counters:\n";
    absl::lts_20250127::str_format_internal::FprintF
              (_stderr,format,
               (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)ZEXT816(0));
    p_Var6 = (pMVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_50 = &(pMVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var6 != local_50) {
      do {
        local_78.ptr = p_Var6 + 1;
        local_70 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                   Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        format_00.size_ = 9;
        format_00.data_ = "  %-12s:\n";
        args.len_ = 1;
        args.ptr_ = (pointer)&local_78;
        absl::lts_20250127::str_format_internal::FprintF(_stderr,format_00,args);
        p_Var5 = p_Var6[2]._M_parent;
        pp_Var1 = &p_Var6[1]._M_right;
        if (p_Var5 != (_Base_ptr)pp_Var1) {
          lVar11 = 0;
          p_Var3 = p_Var5;
          do {
            for (p_Var7 = p_Var3[1]._M_right; p_Var7 != *(_Base_ptr *)(p_Var3 + 2);
                p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
              lVar11 = lVar11 + **(long **)p_Var7;
            }
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          } while (p_Var3 != (_Base_ptr)pp_Var1);
          local_58 = p_Var6;
          if (p_Var5 != (_Base_ptr)pp_Var1) {
            auVar12._8_4_ = (int)((ulong)lVar11 >> 0x20);
            auVar12._0_8_ = lVar11;
            auVar12._12_4_ = 0x45300000;
            dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
            local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
            do {
              output = _stderr;
              lVar9 = 0;
              for (p_Var6 = p_Var5[1]._M_right; p_Var6 != *(_Base_ptr *)(p_Var5 + 2);
                  p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
                lVar9 = lVar9 + **(long **)p_Var6;
              }
              if (*(char *)&p_Var5[1]._M_left == '\0') {
                pDVar4 = (Data *)std::
                                 get<0ul,long,std::basic_string_view<char,std::char_traits<char>>>
                                           ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)(p_Var5 + 1));
                local_78 = *pDVar4;
                local_70 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<long>;
                sVar8 = 0xf;
                pcVar10 = "    %9d : %10zu";
              }
              else {
                local_78.ptr = std::
                               get<1ul,long,std::basic_string_view<char,std::char_traits<char>>>
                                         ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                           *)(p_Var5 + 1));
                local_70 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                           Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                sVar8 = 0x10;
                pcVar10 = "    %-10s: %10zu";
              }
              local_60 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                         Dispatch<unsigned_long>;
              format_01.size_ = sVar8;
              format_01.data_ = pcVar10;
              args_00.len_ = 2;
              args_00.ptr_ = (pointer)&local_78;
              local_68 = lVar9;
              absl::lts_20250127::str_format_internal::FprintF(output,format_01,args_00);
              if ((lVar11 != 0) && ((_Base_ptr)0x1 < local_58[2]._M_right)) {
                auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
                auVar13._0_8_ = lVar9;
                auVar13._12_4_ = 0x45300000;
                local_78 = (Data)((((auVar13._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) *
                                  100.0) / local_48);
                local_70 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
                format_02.size_ = 10;
                format_02.data_ = " (%5.2f%%)";
                args_01.len_ = 1;
                args_01.ptr_ = (pointer)&local_78;
                absl::lts_20250127::str_format_internal::FprintF(_stderr,format_02,args_01);
              }
              format_03.size_ = 1;
              format_03.data_ = "\n";
              absl::lts_20250127::str_format_internal::FprintF
                        (_stderr,format_03,
                         (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)
                         ZEXT816(0));
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            } while (p_Var5 != (_Base_ptr)pp_Var1);
          }
          p_Var6 = local_58;
          if ((lVar11 != 0) && ((_Base_ptr)0x1 < local_58[2]._M_right)) {
            local_78.ptr = "Total";
            local_70 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<char_const*>
            ;
            local_60 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                       Dispatch<unsigned_long>;
            format_04.size_ = 0x11;
            format_04.data_ = "    %-10s: %10zu\n";
            args_02.len_ = 2;
            args_02.ptr_ = (pointer)&local_78;
            local_68 = lVar11;
            absl::lts_20250127::str_format_internal::FprintF(_stderr,format_04,args_02);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_50);
    }
  }
  return;
}

Assistant:

static void PrintAllCounters() {
  auto& counters = CounterMap();
  if (counters.empty()) return;
  absl::FPrintF(stderr, "Protobuf debug counters:\n");
  for (auto& [category_name, category_map] : counters) {
    // Example output:
    //
    //   Category  :
    //     Value 1 : 1234 (12.34%)
    //     Value 2 : 2345 (23.45%)
    //     Total   : 3579
    absl::FPrintF(stderr, "  %-12s:\n", category_name);
    size_t total = 0;
    for (auto& entry : category_map) {
      for (auto* counter : entry.second) {
        total += counter->value();
      }
    }
    for (auto& [subname, counter_vector] : category_map) {
      size_t value = 0;
      for (auto* counter : counter_vector) {
        value += counter->value();
      }
      if (std::holds_alternative<int64_t>(subname)) {
        // For integers, right align
        absl::FPrintF(stderr, "    %9d : %10zu", std::get<int64_t>(subname),
                      value);
      } else {
        // For strings, left align
        absl::FPrintF(stderr, "    %-10s: %10zu",
                      std::get<absl::string_view>(subname), value);
      }
      if (total != 0 && category_map.size() > 1) {
        absl::FPrintF(
            stderr, " (%5.2f%%)",
            100. * static_cast<double>(value) / static_cast<double>(total));
      }
      absl::FPrintF(stderr, "\n");
    }
    if (total != 0 && category_map.size() > 1) {
      absl::FPrintF(stderr, "    %-10s: %10zu\n", "Total", total);
    }
  }
}